

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_TypeRules.h
# Opt level: O1

ArraySize soul::TypeRules::checkArraySizeAndThrowErrorIfIllegal<soul::AST::Context&,long>
                    (Context *errorContext,long size)

{
  CompileMessage local_50;
  
  if (size - 1U < 0x7fffffff) {
    return size;
  }
  if (size < 1) {
    CompileMessageHelpers::createMessage<>(&local_50,syntax,error,"Illegal array size");
  }
  else {
    CompileMessageHelpers::createMessage<>(&local_50,syntax,error,"Too many elements");
  }
  AST::Context::throwError(errorContext,&local_50,false);
}

Assistant:

static Type::ArraySize checkArraySizeAndThrowErrorIfIllegal (Thrower&& errorContext, SizeType size)
    {
        if (! Type::canBeSafelyCastToArraySize ((int64_t) size))
            errorContext.throwError (size > 0 ? Errors::tooManyElements()
                                              : Errors::illegalArraySize());

        return static_cast<Type::ArraySize> (size);
    }